

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

void JSON::writeDictionaryItem(Pipeline *p,bool *first,string *key,JSON *value,size_t depth)

{
  size_t __n;
  
  __n = depth;
  writeDictionaryKey(p,first,key,depth);
  write(value,(int)p,(void *)depth,__n);
  return;
}

Assistant:

void
JSON::writeDictionaryItem(
    Pipeline* p, bool& first, std::string const& key, JSON const& value, size_t depth)
{
    writeDictionaryKey(p, first, key, depth);
    value.write(p, depth);
}